

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

void pnga_get_proc_index(Integer g_a,Integer iproc,Integer *index)

{
  global_array_t *pgVar1;
  Integer IVar2;
  long lVar3;
  long lVar4;
  
  pgVar1 = GA;
  if (GA[g_a + 1000].distr_type - 3U < 2) {
    lVar3 = (long)GA[g_a + 1000].ndim;
    *index = iproc % (long)GA[g_a + 1000].nblock[0];
    if (1 < lVar3) {
      IVar2 = *index;
      lVar4 = 0;
      do {
        iproc = (iproc - IVar2) / (long)pgVar1[g_a + 1000].nblock[lVar4];
        IVar2 = iproc % (long)pgVar1[g_a + 1000].nblock[lVar4 + 1];
        index[lVar4 + 1] = IVar2;
        lVar4 = lVar4 + 1;
      } while (lVar3 + -1 != lVar4);
    }
  }
  else {
    if (GA[g_a + 1000].distr_type != 2) {
      pnga_error("Global array does not use ScaLAPACK data distribution",0);
      return;
    }
    lVar3 = (long)GA[g_a + 1000].ndim;
    *index = iproc % (long)GA[g_a + 1000].nblock[0];
    if (1 < lVar3) {
      IVar2 = *index;
      lVar4 = 0;
      do {
        iproc = (iproc - IVar2) / (long)pgVar1[g_a + 1000].nblock[lVar4];
        IVar2 = iproc % (long)pgVar1[g_a + 1000].nblock[lVar4 + 1];
        index[lVar4 + 1] = IVar2;
        lVar4 = lVar4 + 1;
      } while (lVar3 + -1 != lVar4);
    }
  }
  return;
}

Assistant:

void pnga_get_proc_index(Integer g_a, Integer iproc, Integer *index)
{
  Integer ga_handle = GA_OFFSET + g_a;
  if (GA[ga_handle].distr_type == SCALAPACK) {
    gam_find_proc_indices(ga_handle, iproc, index);
  } else if (GA[ga_handle].distr_type == TILED ||
      GA[ga_handle].distr_type == TILED_IRREG) {
    gam_find_tile_proc_indices(ga_handle, iproc, index);
  } else {
    pnga_error("Global array does not use ScaLAPACK data distribution",0);
  }
  return;
}